

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t sysbvm_integer_negated(sysbvm_context_t *context,sysbvm_tuple_t integer)

{
  sysbvm_tuple_t sVar1;
  sysbvm_integer_t *integer_00;
  sysbvm_tuple_t sVar2;
  
  if ((integer & 0xf) != 0) {
    sVar1 = sysbvm_tuple_integer_encodeInt64(context,-((long)integer >> 4));
    return sVar1;
  }
  integer_00 = (sysbvm_integer_t *)sysbvm_context_shallowCopy(context,integer);
  sVar2 = sysbvm_tuple_getType(context,(sysbvm_tuple_t)integer_00);
  sVar1 = (context->roots).largePositiveIntegerType;
  if (sVar2 == sVar1) {
    sVar1 = (context->roots).largeNegativeIntegerType;
  }
  (integer_00->header).field_0.typePointer = sVar1;
  sVar1 = sysbvm_integer_normalize(context,integer_00);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_negated(sysbvm_context_t *context, sysbvm_tuple_t integer)
{
    if(sysbvm_tuple_isImmediate(integer))
    {
        sysbvm_stuple_t integerValue = sysbvm_tuple_integer_decodeSmall(integer);
        return sysbvm_tuple_integer_encodeInt64(context, -integerValue);
    }

    // Shallow copy and swap the integer type.
    sysbvm_tuple_t negatedInteger = sysbvm_context_shallowCopy(context, integer);
    sysbvm_tuple_t integerType = sysbvm_tuple_getType(context, negatedInteger);
    sysbvm_tuple_setType(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(negatedInteger), integerType == context->roots.largePositiveIntegerType ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType);
    return sysbvm_integer_normalize(context, (sysbvm_integer_t*)negatedInteger);
}